

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void CLI::AsNumberWithUnit::validate_mapping<float>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                *mapping,Options opts)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type_conflict2 mVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *p_Var4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  mapped_type_conflict2 *pmVar8;
  _Base_ptr p_Var9;
  ValidationError *pVVar10;
  char *pcVar11;
  string s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  lower_mapping;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  key_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  key_type local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var6 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      if ((opts & CASE_INSENSITIVE) != CASE_SENSITIVE) {
        local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8._M_impl.super__Rb_tree_header._M_header;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var9 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_98 = &mapping->_M_t;
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          paVar2 = &local_128.field_2;
          do {
            local_108 = &local_f8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_108,*(long *)(p_Var9 + 1),
                       (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_108,local_108->_M_local_buf + local_100,local_108);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            if (local_108 == &local_f8) {
              local_e8.field_2._8_8_ = local_f8._8_8_;
            }
            else {
              local_e8._M_dataplus._M_p = (pointer)local_108;
            }
            local_e8.field_2._M_allocated_capacity._1_7_ = local_f8._M_allocated_capacity._1_7_;
            local_e8.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
            local_e8._M_string_length = local_100;
            local_100 = 0;
            local_f8._M_local_buf[0] = '\0';
            local_108 = &local_f8;
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                    ::find(&local_c8,&local_e8);
            if ((_Rb_tree_header *)cVar7._M_node != &local_c8._M_impl.super__Rb_tree_header) {
              pVVar10 = (ValidationError *)__cxa_allocate_exception(0x38);
              local_128._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,
                         "Several matching lowercase unit representations are found: ","");
              ::std::operator+(&local_50,&local_128,&local_e8);
              ValidationError::ValidationError(pVVar10,&local_50);
              __cxa_throw(pVVar10,&ValidationError::typeinfo,Error::~Error);
            }
            mVar3 = (mapped_type_conflict2)p_Var9[2]._M_color;
            local_148 = &local_138;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,*(long *)(p_Var9 + 1),
                       (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_148,local_148->_M_local_buf + local_140,local_148);
            if (local_148 == &local_138) {
              local_128.field_2._8_8_ = local_138._8_8_;
              local_128._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_128._M_dataplus._M_p = (pointer)local_148;
            }
            local_128.field_2._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
            local_128.field_2._M_local_buf[0] = local_138._M_local_buf[0];
            local_128._M_string_length = local_140;
            local_140 = 0;
            local_138._M_local_buf[0] = '\0';
            local_148 = &local_138;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                                   *)&local_c8,&local_128);
            *pmVar8 = mVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != paVar2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
            if (local_148 != &local_138) {
              operator_delete(local_148);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var1);
        }
        p_Var4 = local_98;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::clear(local_98);
        if (local_c8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          (p_Var4->_M_impl).super__Rb_tree_header._M_header._M_color =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_color;
          (p_Var4->_M_impl).super__Rb_tree_header._M_header._M_parent =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_parent;
          (p_Var4->_M_impl).super__Rb_tree_header._M_header._M_left =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
          (p_Var4->_M_impl).super__Rb_tree_header._M_header._M_right =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_c8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var1->_M_header;
          (p_Var4->_M_impl).super__Rb_tree_header._M_node_count =
               local_c8._M_impl.super__Rb_tree_header._M_node_count;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_c8._M_impl.super__Rb_tree_header._M_header;
          local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::~_Rb_tree(&local_c8);
      }
      return;
    }
    if (p_Var6[1]._M_parent == (_Base_ptr)0x0) {
      pVVar10 = (ValidationError *)__cxa_allocate_exception(0x38);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unit must not be empty.","");
      ValidationError::ValidationError(pVVar10,&local_70);
      __cxa_throw(pVVar10,&ValidationError::typeinfo,Error::~Error);
    }
    pcVar11 = (char *)((long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
    _Var5 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::isalpha(std::__cxx11::string_const&)::_lambda(char)_1_>>
                      (*(long *)(p_Var6 + 1),pcVar11);
    if (_Var5._M_current != pcVar11) break;
    p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
  }
  pVVar10 = (ValidationError *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Unit must contain only letters.","");
  ValidationError::ValidationError(pVVar10,&local_90);
  __cxa_throw(pVVar10,&ValidationError::typeinfo,Error::~Error);
}

Assistant:

static void validate_mapping(std::map<std::string, Number> &mapping, Options opts) {
        for(auto &kv : mapping) {
            if(kv.first.empty()) {
                throw ValidationError("Unit must not be empty.");
            }
            if(!detail::isalpha(kv.first)) {
                throw ValidationError("Unit must contain only letters.");
            }
        }

        // make all units lowercase if CASE_INSENSITIVE
        if(opts & CASE_INSENSITIVE) {
            std::map<std::string, Number> lower_mapping;
            for(auto &kv : mapping) {
                auto s = detail::to_lower(kv.first);
                if(lower_mapping.count(s)) {
                    throw ValidationError(std::string("Several matching lowercase unit representations are found: ") +
                                          s);
                }
                lower_mapping[detail::to_lower(kv.first)] = kv.second;
            }
            mapping = std::move(lower_mapping);
        }
    }